

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

void sort_quests(int32 **qarr,int32 *nqfone,uint32 nfone,int32 *nquests)

{
  long lVar1;
  int32 *piVar2;
  void *ptr;
  void *ptr_00;
  int iVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  ulong n_elem;
  int32 iVar8;
  long lVar9;
  long local_40;
  
  ptr = __ckd_calloc__((long)*nquests,4,
                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
                       ,0x2d1);
  if (0 < *nquests) {
    n_elem = (ulong)nfone;
    local_40 = 1;
    lVar7 = 0;
    do {
      lVar1 = lVar7 + 1;
      lVar9 = local_40;
      if (lVar1 < *nquests) {
        do {
          if (nqfone[lVar9] + nqfone[lVar7] == nfone) {
            ptr_00 = __ckd_calloc__(n_elem,4,
                                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
                                    ,0x2d6);
            if (0 < nqfone[lVar7]) {
              piVar2 = qarr[lVar7];
              lVar4 = 0;
              do {
                *(undefined4 *)((long)ptr_00 + (long)piVar2[lVar4] * 4) = 1;
                lVar4 = lVar4 + 1;
              } while (lVar4 < nqfone[lVar7]);
            }
            iVar3 = nqfone[lVar9];
            if (0 < iVar3) {
              piVar2 = qarr[lVar9];
              lVar4 = 0;
              do {
                *(undefined4 *)((long)ptr_00 + (long)piVar2[lVar4] * 4) = 1;
                lVar4 = lVar4 + 1;
                iVar3 = nqfone[lVar9];
              } while (lVar4 < iVar3);
            }
            uVar5 = 0;
            uVar6 = uVar5;
            if (nfone != 0) {
              do {
                uVar6 = uVar5;
                if (*(int *)((long)ptr_00 + uVar5 * 4) == 0) break;
                uVar5 = uVar5 + 1;
                uVar6 = n_elem;
              } while (n_elem != uVar5);
            }
            if ((uint32)uVar6 == nfone) {
              lVar4 = lVar9;
              if (iVar3 < nqfone[lVar7]) {
                lVar4 = lVar7;
              }
              *(undefined4 *)((long)ptr + lVar4 * 4) = 1;
            }
            ckd_free(ptr_00);
          }
          lVar9 = lVar9 + 1;
        } while ((int)lVar9 < *nquests);
      }
      local_40 = local_40 + 1;
      lVar7 = lVar1;
    } while (lVar1 < *nquests);
  }
  if (*nquests < 1) {
    iVar8 = 0;
  }
  else {
    lVar7 = 0;
    iVar8 = 0;
    do {
      if (*(int *)((long)ptr + lVar7 * 4) == 1) {
        ckd_free(qarr[lVar7]);
      }
      else {
        qarr[iVar8] = qarr[lVar7];
        nqfone[iVar8] = nqfone[lVar7];
        iVar8 = iVar8 + 1;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < *nquests);
  }
  *nquests = iVar8;
  ckd_free(ptr);
  return;
}

Assistant:

void   sort_quests(int32 **qarr, int32 *nqfone, uint32 nfone, int32 *nquests)
{
    int32  i, j, k;
    int32  *marker, *flag;

    marker = (int32 *) ckd_calloc(*nquests,sizeof(int32));

    for (i=0;i<*nquests;i++){
        for (j=i+1; j < *nquests; j++){
            if (nqfone[i]+nqfone[j] != nfone) continue;
            flag = (int32 *) ckd_calloc(nfone,sizeof(int32));
            for (k=0;k < nqfone[i];k++) flag[qarr[i][k]] = 1;
            for (k=0;k < nqfone[j];k++) flag[qarr[j][k]] = 1;
            for (k=0;k < nfone;k++) if (flag[k] == 0) break;
            if (k == nfone) { /* the two questions are complements */
                if (nqfone[i] > nqfone[j]) marker [i] = 1;
                else marker[j] = 1;
            }
            ckd_free((void *)flag);
        }
    }
    for (i=0,j=0;i<*nquests;i++){
        if (marker[i] == 1) {
            ckd_free((void *)qarr[i]);
            continue;
        }
        qarr[j] = qarr[i];
        nqfone[j] = nqfone[i];
        j++;
    }
    *nquests = j;
       
    ckd_free((void *) marker);
}